

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionDispatcher.cpp
# Opt level: O2

cbtCollisionAlgorithm * __thiscall
cbtCollisionDispatcher::findAlgorithm
          (cbtCollisionDispatcher *this,cbtCollisionObjectWrapper *body0Wrap,
          cbtCollisionObjectWrapper *body1Wrap,cbtPersistentManifold *sharedManifold,
          ecbtDispatcherQueryType algoType)

{
  int iVar1;
  undefined4 extraout_var;
  cbtCollisionAlgorithmCreateFunc *(*papcVar2) [42];
  
  papcVar2 = this->m_doubleDispatchContactPoints;
  if (algoType != BT_CONTACT_POINT_ALGORITHMS) {
    papcVar2 = this->m_doubleDispatchClosestPoints;
  }
  iVar1 = (*papcVar2[body0Wrap->m_shape->m_shapeType][body1Wrap->m_shape->m_shapeType]->
            _vptr_cbtCollisionAlgorithmCreateFunc[2])();
  return (cbtCollisionAlgorithm *)CONCAT44(extraout_var,iVar1);
}

Assistant:

cbtCollisionAlgorithm* cbtCollisionDispatcher::findAlgorithm(const cbtCollisionObjectWrapper* body0Wrap, const cbtCollisionObjectWrapper* body1Wrap, cbtPersistentManifold* sharedManifold, ecbtDispatcherQueryType algoType)
{
	cbtCollisionAlgorithmConstructionInfo ci;

	ci.m_dispatcher1 = this;
	ci.m_manifold = sharedManifold;
	cbtCollisionAlgorithm* algo = 0;
	if (algoType == BT_CONTACT_POINT_ALGORITHMS)
	{
		algo = m_doubleDispatchContactPoints[body0Wrap->getCollisionShape()->getShapeType()][body1Wrap->getCollisionShape()->getShapeType()]->CreateCollisionAlgorithm(ci, body0Wrap, body1Wrap);
	}
	else
	{
		algo = m_doubleDispatchClosestPoints[body0Wrap->getCollisionShape()->getShapeType()][body1Wrap->getCollisionShape()->getShapeType()]->CreateCollisionAlgorithm(ci, body0Wrap, body1Wrap);
	}

	return algo;
}